

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_types.hpp
# Opt level: O1

void __thiscall boost::unique_lock<boost::mutex>::lock(unique_lock<boost::mutex> *this)

{
  lock_error lStack_48;
  
  if (this->m == (mutex *)0x0) {
    lock_error::lock_error(&lStack_48,1,"boost unique_lock has no mutex");
    throw_exception<boost::lock_error>(&lStack_48);
  }
  if (this->is_locked != true) {
    mutex::lock(this->m);
    this->is_locked = true;
    return;
  }
  lock_error::lock_error(&lStack_48,0x23,"boost unique_lock owns already the mutex");
  throw_exception<boost::lock_error>(&lStack_48);
}

Assistant:

void lock()
    {
      if (m == 0)
      {
        boost::throw_exception(
            boost::lock_error(static_cast<int>(system::errc::operation_not_permitted), "boost unique_lock has no mutex"));
      }
      if (owns_lock())
      {
        boost::throw_exception(
            boost::lock_error(static_cast<int>(system::errc::resource_deadlock_would_occur), "boost unique_lock owns already the mutex"));
      }
      m->lock();
      is_locked = true;
    }